

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.hxx
# Opt level: O1

size_type __thiscall
cmsys::
hashtable<std::pair<const_char_*const,_int>,_const_char_*,_cmsys::hash<const_char_*>,_cmsys::hash_select1st<const_char_*const,_int>,_std::equal_to<const_char_*>,_std::allocator<char>_>
::erase(hashtable<std::pair<const_char_*const,_int>,_const_char_*,_cmsys::hash<const_char_*>,_cmsys::hash_select1st<const_char_*const,_int>,_std::equal_to<const_char_*>,_std::allocator<char>_>
        *this,key_type *__key)

{
  pointer pp_Var1;
  _Hashtable_node<std::pair<const_char_*const,_int>_> *p_Var2;
  _Hashtable_node<std::pair<const_char_*const,_int>_> *p_Var3;
  _Hashtable_node<std::pair<const_char_*const,_int>_> *p_Var4;
  _Hashtable_node<std::pair<const_char_*const,_int>_> *p_Var5;
  _Hashtable_node<std::pair<const_char_*const,_int>_> *p_Var6;
  ulong uVar7;
  char *pcVar8;
  char cVar9;
  size_type sVar10;
  
  pp_Var1 = (this->_M_buckets).
            super__Vector_base<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*,_std::allocator<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pcVar8 = *__key;
  cVar9 = *pcVar8;
  if (cVar9 == '\0') {
    uVar7 = 0;
  }
  else {
    uVar7 = 0;
    do {
      pcVar8 = pcVar8 + 1;
      uVar7 = (long)cVar9 + uVar7 * 5;
      cVar9 = *pcVar8;
    } while (cVar9 != '\0');
  }
  sVar10 = 0;
  uVar7 = uVar7 % (ulong)((long)(this->_M_buckets).
                                super__Vector_base<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*,_std::allocator<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pp_Var1 >> 3);
  p_Var2 = pp_Var1[uVar7];
  if (p_Var2 != (_Hashtable_node<std::pair<const_char_*const,_int>_> *)0x0) {
    sVar10 = 0;
    p_Var6 = p_Var2;
    p_Var3 = p_Var2->_M_next;
    while (p_Var5 = p_Var3, p_Var4 = p_Var6,
          p_Var5 != (_Hashtable_node<std::pair<const_char_*const,_int>_> *)0x0) {
      p_Var6 = p_Var5;
      p_Var3 = p_Var5->_M_next;
      if ((p_Var5->_M_val).first == *__key) {
        p_Var4->_M_next = p_Var5->_M_next;
        operator_delete(p_Var5,0x18);
        p_Var3 = p_Var4->_M_next;
        sVar10 = sVar10 + 1;
        this->_M_num_elements = this->_M_num_elements - 1;
        p_Var6 = p_Var4;
      }
    }
    if ((p_Var2->_M_val).first == *__key) {
      (this->_M_buckets).
      super__Vector_base<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*,_std::allocator<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar7] = p_Var2->_M_next;
      operator_delete(p_Var2,0x18);
      sVar10 = sVar10 + 1;
      this->_M_num_elements = this->_M_num_elements - 1;
    }
  }
  return sVar10;
}

Assistant:

typename hashtable<_Val,_Key,_HF,_Ex,_Eq,_All>::size_type
hashtable<_Val,_Key,_HF,_Ex,_Eq,_All>::erase(const key_type& __key)
{
  const size_type __n = _M_bkt_num_key(__key);
  _Node* __first = _M_buckets[__n];
  size_type __erased = 0;

  if (__first) {
    _Node* __cur = __first;
    _Node* __next = __cur->_M_next;
    while (__next) {
      if (_M_equals(_M_get_key(__next->_M_val), __key)) {
        __cur->_M_next = __next->_M_next;
        _M_delete_node(__next);
        __next = __cur->_M_next;
        ++__erased;
        --_M_num_elements;
      }
      else {
        __cur = __next;
        __next = __cur->_M_next;
      }
    }
    if (_M_equals(_M_get_key(__first->_M_val), __key)) {
      _M_buckets[__n] = __first->_M_next;
      _M_delete_node(__first);
      ++__erased;
      --_M_num_elements;
    }
  }
  return __erased;
}